

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O0

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::make_constraint<spvtools::opt::DependenceNone>
          (LoopDependenceAnalysis *this)

{
  pointer pCVar1;
  reference this_00;
  value_type local_18;
  LoopDependenceAnalysis *local_10;
  LoopDependenceAnalysis *this_local;
  
  local_10 = this;
  pCVar1 = (pointer)::operator_new(0x10);
  DependenceNone::DependenceNone((DependenceNone *)pCVar1);
  std::unique_ptr<spvtools::opt::Constraint,std::default_delete<spvtools::opt::Constraint>>::
  unique_ptr<std::default_delete<spvtools::opt::Constraint>,void>
            ((unique_ptr<spvtools::opt::Constraint,std::default_delete<spvtools::opt::Constraint>> *
             )&local_18,pCVar1);
  std::__cxx11::
  list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ::push_back(&this->constraints_,&local_18);
  std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>::
  ~unique_ptr(&local_18);
  this_00 = std::__cxx11::
            list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
            ::back(&this->constraints_);
  pCVar1 = std::
           unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>::
           get(this_00);
  return pCVar1;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }